

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O0

void __thiscall
luna::Library::RegisterFunc(Library *this,Table *table,char *name,CFunctionType func)

{
  Value v;
  Value k;
  ValueT in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  anon_union_8_9_8deb4486_for_Value_0 in_stack_ffffffffffffffd0;
  
  Value::Value((Value *)&stack0xffffffffffffffd0);
  State::GetString((State *)in_stack_ffffffffffffffd0.obj_,
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  Value::Value((Value *)&stack0xffffffffffffffc0);
  Table::SetValue((Table *)this,(Value *)table,(Value *)name);
  return;
}

Assistant:

void Library::RegisterFunc(Table *table, const char *name, CFunctionType func)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = state_->GetString(name);

        Value v;
        v.type_ = ValueT_CFunction;
        v.cfunc_ = func;
        table->SetValue(k, v);
    }